

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

int run_test_getaddrinfo_concurrent(void)

{
  int iVar1;
  undefined4 *puVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  uv_getaddrinfo_t *req;
  long lVar5;
  char *pcVar6;
  int *piVar7;
  
  req = getaddrinfo_handles;
  piVar7 = callback_counts;
  lVar5 = 0;
  do {
    if (lVar5 == 10) {
      puVar3 = uv_default_loop();
      lVar5 = 0;
      uv_run(puVar3,UV_RUN_DEFAULT);
      goto LAB_0012c90c;
    }
    *piVar7 = 0;
    puVar2 = (undefined4 *)malloc(4);
    if (puVar2 == (undefined4 *)0x0) {
      pcVar6 = "data != NULL";
      uVar4 = 0xaa;
      goto LAB_0012c995;
    }
    *puVar2 = (int)lVar5;
    req->data = puVar2;
    puVar3 = uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar3,req,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    lVar5 = lVar5 + 1;
    req = req + 1;
    piVar7 = piVar7 + 1;
  } while (iVar1 == 0);
  pcVar6 = "r == 0";
  uVar4 = 0xb4;
  goto LAB_0012c995;
  while (piVar7 = (int *)((long)callback_counts + lVar5), lVar5 = lVar5 + 4, *piVar7 == 1) {
LAB_0012c90c:
    if (lVar5 == 0x28) {
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar6 = "0 == uv_loop_close(uv_default_loop())";
      uVar4 = 0xbd;
      goto LAB_0012c995;
    }
  }
  pcVar6 = "callback_counts[i] == 1";
  uVar4 = 0xba;
LAB_0012c995:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
          ,uVar4,pcVar6);
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_concurrent) {
  int i, r;
  int* data;

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    callback_counts[i] = 0;

    data = (int*)malloc(sizeof(int));
    ASSERT(data != NULL);
    *data = i;
    getaddrinfo_handles[i].data = data;

    r = uv_getaddrinfo(uv_default_loop(),
                       &getaddrinfo_handles[i],
                       &getaddrinfo_cuncurrent_cb,
                       name,
                       NULL,
                       NULL);
    ASSERT(r == 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    ASSERT(callback_counts[i] == 1);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}